

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O0

int impl_verify_picnic3(picnic_instance_t *instance,uint8_t *plaintext,uint8_t *public_key,
                       uint8_t *msg,size_t msglen,uint8_t *signature,size_t signature_len)

{
  _Bool _Var1;
  uint8_t *in_RCX;
  signature2_t *in_RDX;
  size_t in_R8;
  picnic_instance_t *in_R9;
  signature2_t sig;
  int ret;
  picnic_instance_t *in_stack_00000210;
  size_t in_stack_00000218;
  uint8_t *in_stack_00000220;
  uint8_t *in_stack_00000228;
  uint8_t *in_stack_00000230;
  signature2_t *in_stack_00000238;
  picnic_instance_t *in_stack_ffffffffffffff68;
  signature2_t *in_stack_ffffffffffffff70;
  int local_34;
  
  local_34 = -1;
  _Var1 = allocateSignature2(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  if ((_Var1) && (local_34 = deserializeSignature2(in_RDX,in_RCX,in_R8,in_R9), local_34 == 0)) {
    local_34 = verify_picnic3(in_stack_00000238,in_stack_00000230,in_stack_00000228,
                              in_stack_00000220,in_stack_00000218,in_stack_00000210);
  }
  freeSignature2(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  return local_34;
}

Assistant:

int impl_verify_picnic3(const picnic_instance_t* instance, const uint8_t* plaintext,
                        const uint8_t* public_key, const uint8_t* msg, size_t msglen,
                        const uint8_t* signature, size_t signature_len) {
  int ret = -1;
  signature2_t sig;
  if (!allocateSignature2(&sig, instance)) {
    goto Exit;
  }

  ret = deserializeSignature2(&sig, signature, signature_len, instance);
  if (ret != EXIT_SUCCESS) {
#if !defined(NDEBUG)
    fprintf(stderr, "Failed to deserialize signature\n");
    fflush(stderr);
#endif
    goto Exit;
  }

  ret = verify_picnic3(&sig, public_key, plaintext, msg, msglen, instance);

Exit:
  freeSignature2(&sig, instance);
  return ret;
}